

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O1

void math::internal::matrix_r_svd<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *vec_s,double *mat_v,
               double *epsilon)

{
  double *mat_r;
  double *mat_u_00;
  undefined1 mat_a_00 [8];
  uint uVar1;
  uint uVar2;
  undefined1 local_70 [8];
  vector<double,_std::allocator<double>_> buffer;
  allocator_type local_31;
  
  uVar2 = cols * rows;
  buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = mat_v;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_70,
             (long)(int)(rows * rows + uVar2 * 2),&local_31);
  mat_a_00 = local_70;
  mat_r = (double *)((long)local_70 + (ulong)(uint)(rows * rows) * 8);
  matrix_qr<double>(mat_a,rows,cols,(double *)local_70,mat_r,epsilon);
  mat_u_00 = mat_r + (int)uVar2;
  matrix_gk_svd<double>
            (mat_r,cols,cols,mat_u_00,vec_s,
             buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,epsilon);
  uVar1 = cols * cols;
  if (uVar1 != uVar2) {
    memset(mat_u_00 + uVar1,0,(long)(int)uVar2 * 8 + (ulong)uVar1 * -8);
  }
  matrix_multiply<double>((double *)mat_a_00,rows,rows,mat_u_00,cols,mat_u);
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70);
  }
  return;
}

Assistant:

void
matrix_r_svd (T const* mat_a, int rows, int cols,
    T* mat_u, T* vec_s, T* mat_v, T const& epsilon)
{
    /* Allocate memory for temp matrices. */
    int const mat_q_size = rows * rows;
    int const mat_r_size = rows * cols;
    int const mat_u_tmp_size = rows * cols;
    std::vector<T> buffer(mat_q_size + mat_r_size + mat_u_tmp_size);
    T* mat_q = &buffer[0];
    T* mat_r = mat_q + mat_q_size;
    T* mat_u_tmp = mat_r + mat_r_size;

    matrix_qr(mat_a, rows, cols, mat_q, mat_r, epsilon);
    matrix_gk_svd(mat_r, cols, cols, mat_u_tmp, vec_s, mat_v, epsilon);
    std::fill(mat_u_tmp + cols * cols, mat_u_tmp + rows * cols, T(0));

    /* Adapt U for big matrices. */
    matrix_multiply(mat_q, rows, rows, mat_u_tmp, cols, mat_u);
}